

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolve.hpp
# Opt level: O2

bool __thiscall soplex::SPxSolverBase<double>::performSolutionPolishing(SPxSolverBase<double> *this)

{
  ClassSet<soplex::SVSetBase<double>::DLPSV> *this_00;
  uint n;
  uint n_00;
  int iVar1;
  Status *pSVar2;
  Status *pSVar3;
  bool bVar4;
  bool bVar5;
  Status SVar6;
  int iVar7;
  SPxOut *pSVar8;
  Status **ppSVar9;
  long lVar10;
  int i_1;
  ulong uVar11;
  int iVar12;
  ulong uVar13;
  int i;
  double b;
  double dVar14;
  double a;
  double dVar15;
  SPxId polishId;
  Verbosity old_verbosity;
  uint local_98;
  int *local_90;
  Status **local_80;
  double local_78;
  undefined8 uStack_70;
  DIdxSet continuousvars;
  double local_48;
  
  if (((-1 < this->maxIters) && (this->maxIters <= (this->super_SPxBasisBase<double>).iterCount)) &&
     (bVar4 = isTimeLimitReached(this,false), !bVar4)) {
    return false;
  }
  if ((this->polishObj == POLISH_OFF) || (SVar6 = status(this), SVar6 != OPTIMAL)) {
    bVar4 = false;
  }
  else {
    pSVar2 = (this->super_SPxBasisBase<double>).thedesc.rowstat.data;
    pSVar3 = (this->super_SPxBasisBase<double>).thedesc.colstat.data;
    polishId.super_DataKey.info = 0;
    polishId.super_DataKey.idx = -1;
    (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x5e])(this);
    pSVar8 = this->spxout;
    if ((pSVar8 != (SPxOut *)0x0) && (3 < (int)pSVar8->m_verbosity)) {
      continuousvars.super_IdxSet._vptr_IdxSet._0_4_ = 4;
      old_verbosity = pSVar8->m_verbosity;
      (*pSVar8->_vptr_SPxOut[2])();
      pSVar8 = soplex::operator<<(this->spxout," --- perform solution polishing");
      std::endl<char,std::char_traits<char>>(pSVar8->m_streams[pSVar8->m_verbosity]);
      (*this->spxout->_vptr_SPxOut[2])(this->spxout,&old_verbosity);
    }
    if (this->theRep == COLUMN) {
      setType(this,ENTER);
      (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
        super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x76])(this);
      local_48 = entertol(this);
      this->instableEnter = false;
      (*this->theratiotester->_vptr_SPxRatioTester[9])
                (this->theratiotester,(ulong)(uint)this->theType);
      if (this->polishObj == POLISH_INTEGRALITY) {
        n = (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.set.
            thenum;
        n_00 = (this->super_SPxLPBase<double>).super_LPColSetBase<double>.super_SVSetBase<double>.
               set.thenum;
        DIdxSet::DIdxSet((DIdxSet *)&old_verbosity,n);
        DIdxSet::DIdxSet(&continuousvars,n_00);
        uVar11 = 0;
        uVar13 = (ulong)n;
        if ((int)n < 1) {
          uVar13 = uVar11;
        }
        for (; uVar13 != uVar11; uVar11 = uVar11 + 1) {
          if ((pSVar2[uVar11] | D_ON_UPPER) == P_ON_UPPER) {
            local_78 = (this->theCoPvec->super_VectorBase<double>).val.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar11];
            uStack_70 = 0;
            dVar14 = epsilon(this);
            dVar15 = ABS(local_78);
            if (dVar15 <= 0.0) {
              dVar15 = 0.0;
            }
            if (dVar15 <= 1.0) {
              dVar15 = 1.0;
            }
            if (ABS(local_78 / dVar15) <= dVar14) {
              DIdxSet::addIdx((DIdxSet *)&old_verbosity,(int)uVar11);
            }
          }
        }
        if ((this->integerVariables).thesize == n_00) {
          uVar11 = 0;
          uVar13 = (ulong)n_00;
          if ((int)n_00 < 1) {
            uVar13 = uVar11;
          }
          for (; uVar13 != uVar11; uVar11 = uVar11 + 1) {
            if ((pSVar3[uVar11] | D_ON_UPPER) == P_ON_UPPER) {
              local_78 = (this->super_SPxLPBase<double>).super_LPColSetBase<double>.object.val.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar11];
              uStack_70 = 0;
              local_80 = (Status **)
                         (this->thePvec->super_VectorBase<double>).val.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar11];
              dVar14 = epsilon(this);
              dVar15 = ABS(local_78 - (double)local_80);
              if (dVar15 <= 0.0) {
                dVar15 = 0.0;
              }
              if (dVar15 <= 1.0) {
                dVar15 = 1.0;
              }
              if ((ABS((local_78 - (double)local_80) / dVar15) <= dVar14) &&
                 ((this->integerVariables).data[uVar11] == 0)) {
                DIdxSet::addIdx(&continuousvars,(int)uVar11);
              }
            }
          }
        }
        bVar4 = false;
        while (!bVar4) {
          uVar13 = (ulong)local_98;
          iVar12 = 0;
          while ((0 < (int)uVar13 && (!bVar4))) {
            polishId = coId(this,local_90[uVar13 - 1]);
            bVar5 = enter(this,&polishId,true);
            (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
              super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x88])(this);
            if (bVar5) {
              iVar12 = iVar12 + 1;
              lVar10 = (long)(int)local_98;
              local_98 = local_98 - 1;
              local_90[uVar13 - 1] = local_90[lVar10 + -1];
              if ((-1 < this->maxIters) &&
                 (this->maxIters <= (this->super_SPxBasisBase<double>).iterCount)) {
                bVar4 = true;
              }
            }
            bVar5 = isTimeLimitReached(this,false);
            if (bVar5) {
              bVar4 = true;
            }
            uVar13 = uVar13 - 1;
          }
          uVar13 = (ulong)(uint)continuousvars.super_IdxSet.num;
          while ((0 < (int)uVar13 && (!bVar4))) {
            polishId = id(this,continuousvars.super_IdxSet.idx[uVar13 - 1]);
            bVar5 = enter(this,&polishId,true);
            (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
              super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x88])(this);
            if (bVar5) {
              iVar12 = iVar12 + 1;
              lVar10 = (long)continuousvars.super_IdxSet.num;
              continuousvars.super_IdxSet.num = continuousvars.super_IdxSet.num + -1;
              continuousvars.super_IdxSet.idx[uVar13 - 1] =
                   continuousvars.super_IdxSet.idx[lVar10 + -1];
              if ((-1 < this->maxIters) &&
                 (this->maxIters <= (this->super_SPxBasisBase<double>).iterCount)) {
                bVar4 = true;
              }
            }
            bVar5 = isTimeLimitReached(this,false);
            if (bVar5) {
              bVar4 = true;
            }
            uVar13 = uVar13 - 1;
          }
          if (iVar12 == 0) {
            bVar4 = true;
          }
          this->polishCount = this->polishCount + iVar12;
        }
        DIdxSet::~DIdxSet(&continuousvars);
      }
      else {
        DIdxSet::DIdxSet((DIdxSet *)&old_verbosity,(this->thecovectors->set).thenum);
        for (lVar10 = 0;
            lVar10 < (this->super_SPxLPBase<double>).super_LPColSetBase<double>.
                     super_SVSetBase<double>.set.thenum; lVar10 = lVar10 + 1) {
          if ((pSVar3[lVar10] | D_ON_UPPER) == P_ON_UPPER) {
            local_78 = (this->super_SPxLPBase<double>).super_LPColSetBase<double>.object.val.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar10];
            uStack_70 = 0;
            local_80 = (Status **)
                       (this->thePvec->super_VectorBase<double>).val.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar10];
            dVar14 = epsilon(this);
            dVar15 = ABS(local_78 - (double)local_80);
            if (dVar15 <= 0.0) {
              dVar15 = 0.0;
            }
            if (dVar15 <= 1.0) {
              dVar15 = 1.0;
            }
            if (ABS((local_78 - (double)local_80) / dVar15) <= dVar14) {
              DIdxSet::addIdx((DIdxSet *)&old_verbosity,(int)lVar10);
            }
          }
        }
        bVar4 = false;
        while (!bVar4) {
          uVar13 = (ulong)local_98;
          iVar12 = 0;
          while ((0 < (int)uVar13 && (!bVar4))) {
            polishId = id(this,local_90[uVar13 - 1]);
            bVar5 = enter(this,&polishId,true);
            (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
              super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x88])(this);
            if (bVar5) {
              iVar12 = iVar12 + 1;
              lVar10 = (long)(int)local_98;
              local_98 = local_98 - 1;
              local_90[uVar13 - 1] = local_90[lVar10 + -1];
              if ((-1 < this->maxIters) &&
                 (this->maxIters <= (this->super_SPxBasisBase<double>).iterCount)) {
                bVar4 = true;
              }
            }
            bVar5 = isTimeLimitReached(this,false);
            if (bVar5) {
              bVar4 = true;
            }
            uVar13 = uVar13 - 1;
          }
          if (iVar12 == 0) {
            bVar4 = true;
          }
          this->polishCount = this->polishCount + iVar12;
        }
      }
    }
    else {
      local_80 = &(this->super_SPxBasisBase<double>).thedesc.colstat.data;
      setType(this,LEAVE);
      (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
        super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x76])(this);
      local_48 = leavetol(this);
      this->instableLeave = false;
      (*this->theratiotester->_vptr_SPxRatioTester[9])
                (this->theratiotester,(ulong)(uint)this->theType);
      iVar12 = (this->super_SPxLPBase<double>).super_LPColSetBase<double>.super_SVSetBase<double>.
               set.thenum;
      iVar1 = (this->integerVariables).thesize;
      this_00 = &(this->super_SPxLPBase<double>).super_LPColSetBase<double>.super_SVSetBase<double>.
                 set;
      if (this->polishObj == POLISH_INTEGRALITY) {
        DIdxSet::DIdxSet((DIdxSet *)&old_verbosity,(this->thecovectors->set).thenum);
        for (lVar10 = 0; lVar10 < (this->thecovectors->set).thenum; lVar10 = lVar10 + 1) {
          polishId.super_DataKey =
               (this->super_SPxBasisBase<double>).theBaseId.data[lVar10].super_DataKey;
          if (polishId.super_DataKey.info < 0) {
            iVar7 = SPxLPBase<double>::number(&this->super_SPxLPBase<double>,&polishId);
            ppSVar9 = &(this->super_SPxBasisBase<double>).thedesc.rowstat.data;
LAB_0019c8f5:
            if (((*ppSVar9)[iVar7] & (P_ON_LOWER|D_FREE)) == P_ON_LOWER) {
              local_78 = (this->theFvec->super_VectorBase<double>).val.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar10];
              uStack_70 = 0;
              dVar14 = epsilon(this);
              dVar15 = ABS(local_78);
              if (dVar15 <= 0.0) {
                dVar15 = 0.0;
              }
              if (dVar15 <= 1.0) {
                dVar15 = 1.0;
              }
              if (ABS(local_78 / dVar15) <= dVar14) {
                DIdxSet::addIdx((DIdxSet *)&old_verbosity,(int)lVar10);
              }
            }
          }
          else if (iVar1 == iVar12) {
            SPxColId::SPxColId((SPxColId *)&continuousvars,&polishId);
            iVar7 = ClassSet<soplex::SVSetBase<double>::DLPSV>::number
                              (this_00,(DataKey *)&continuousvars);
            if ((this->integerVariables).data[iVar7] != 1) {
              iVar7 = SPxLPBase<double>::number(&this->super_SPxLPBase<double>,&polishId);
              ppSVar9 = local_80;
              goto LAB_0019c8f5;
            }
          }
        }
        bVar4 = false;
        while (!bVar4) {
          uVar13 = (ulong)local_98;
          iVar12 = 0;
          while ((0 < (int)uVar13 && (!bVar4))) {
            bVar5 = leave(this,local_90[uVar13 - 1],true);
            (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
              super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x88])(this);
            if (bVar5) {
              iVar12 = iVar12 + 1;
              lVar10 = (long)(int)local_98;
              local_98 = local_98 - 1;
              local_90[uVar13 - 1] = local_90[lVar10 + -1];
              if ((-1 < this->maxIters) &&
                 (this->maxIters <= (this->super_SPxBasisBase<double>).iterCount)) {
                bVar4 = true;
              }
            }
            bVar5 = isTimeLimitReached(this,false);
            if (bVar5) {
              bVar4 = true;
            }
            uVar13 = uVar13 - 1;
          }
          if (iVar12 == 0) {
            bVar4 = true;
          }
          this->polishCount = this->polishCount + iVar12;
        }
      }
      else {
        DIdxSet::DIdxSet((DIdxSet *)&old_verbosity,(this->thecovectors->set).thenum);
        for (lVar10 = 0; lVar10 < (this->thecovectors->set).thenum; lVar10 = lVar10 + 1) {
          polishId.super_DataKey =
               (this->super_SPxBasisBase<double>).theBaseId.data[lVar10].super_DataKey;
          if (-1 < polishId.super_DataKey.info) {
            if (iVar1 == iVar12) {
              SPxColId::SPxColId((SPxColId *)&continuousvars,&polishId);
              iVar7 = ClassSet<soplex::SVSetBase<double>::DLPSV>::number
                                (this_00,(DataKey *)&continuousvars);
              if ((this->integerVariables).data[iVar7] == 0) goto LAB_0019cb07;
            }
            if (((*local_80)[lVar10] & (P_ON_LOWER|D_FREE)) == P_ON_LOWER) {
              local_78 = (this->theFvec->super_VectorBase<double>).val.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar10];
              uStack_70 = 0;
              dVar14 = epsilon(this);
              dVar15 = ABS(local_78);
              if (dVar15 <= 0.0) {
                dVar15 = 0.0;
              }
              if (dVar15 <= 1.0) {
                dVar15 = 1.0;
              }
              if (ABS(local_78 / dVar15) <= dVar14) {
                DIdxSet::addIdx((DIdxSet *)&old_verbosity,(int)lVar10);
              }
            }
          }
LAB_0019cb07:
        }
        bVar4 = false;
        while (!bVar4) {
          uVar13 = (ulong)local_98;
          iVar12 = 0;
          while ((0 < (int)uVar13 && (!bVar4))) {
            bVar5 = leave(this,local_90[uVar13 - 1],true);
            (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
              super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x88])(this);
            if (bVar5) {
              iVar12 = iVar12 + 1;
              lVar10 = (long)(int)local_98;
              local_98 = local_98 - 1;
              local_90[uVar13 - 1] = local_90[lVar10 + -1];
              if ((-1 < this->maxIters) &&
                 (this->maxIters <= (this->super_SPxBasisBase<double>).iterCount)) {
                bVar4 = true;
              }
            }
            bVar5 = isTimeLimitReached(this,false);
            if (bVar5) {
              bVar4 = true;
            }
            uVar13 = uVar13 - 1;
          }
          if (iVar12 == 0) {
            bVar4 = true;
          }
          this->polishCount = this->polishCount + iVar12;
        }
      }
    }
    DIdxSet::~DIdxSet((DIdxSet *)&old_verbosity);
    pSVar8 = this->spxout;
    if ((pSVar8 != (SPxOut *)0x0) && (2 < (int)pSVar8->m_verbosity)) {
      continuousvars.super_IdxSet._vptr_IdxSet._0_4_ = 3;
      old_verbosity = pSVar8->m_verbosity;
      (*pSVar8->_vptr_SPxOut[2])();
      pSVar8 = soplex::operator<<(this->spxout," --- finished solution polishing (");
      pSVar8 = soplex::operator<<(pSVar8,this->polishCount);
      pSVar8 = soplex::operator<<(pSVar8," pivots)");
      std::endl<char,std::char_traits<char>>(pSVar8->m_streams[pSVar8->m_verbosity]);
      (*this->spxout->_vptr_SPxOut[2])(this->spxout,&old_verbosity);
    }
    if ((this->super_SPxBasisBase<double>).thestatus != OPTIMAL) {
      (this->super_SPxBasisBase<double>).thestatus = OPTIMAL;
    }
    (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x5e])(this);
    bVar4 = EQrel<double,double,double>(a,b,local_48);
    bVar4 = !bVar4;
  }
  return bVar4;
}

Assistant:

bool SPxSolverBase<R>::performSolutionPolishing()
{
   // catch rare case that the iteration limit is exactly reached at optimality
   bool stop = (maxIters >= 0 && iterations() >= maxIters && !isTimeLimitReached());

   // only polish an already optimal basis
   if(stop || polishObj == POLISH_OFF || status() != OPTIMAL)
      return false;

   int nSuccessfulPivots;
   const typename SPxBasisBase<R>::Desc& ds = this->desc();
   const typename SPxBasisBase<R>::Desc::Status* rowstatus = ds.rowStatus();
   const typename SPxBasisBase<R>::Desc::Status* colstatus = ds.colStatus();
   typename SPxBasisBase<R>::Desc::Status stat;
   SPxId polishId;
   bool success = false;

   R alloweddeviation;
   R origval = value();

   SPX_MSG_INFO2((*this->spxout), (*this->spxout) << " --- perform solution polishing" << std::endl;)

   if(rep() == COLUMN)
   {
      setType(ENTER); // use primal simplex to preserve feasibility
      init();
      alloweddeviation = entertol();

      instableEnter = false;
      theratiotester->setType(type());

      int nrows = this->nRows();
      int ncols = this->nCols();

      assert(nrows >= 0);
      assert(ncols >= 0);

      if(polishObj == POLISH_INTEGRALITY)
      {
         DIdxSet slackcandidates(nrows);
         DIdxSet continuousvars(ncols);

         // collect nonbasic slack variables that could be made basic
         for(int i = 0; i < nrows; ++i)
         {
            // only check nonbasic rows, skip equations
            if(rowstatus[i] ==  SPxBasisBase<R>::Desc::P_ON_LOWER
                  || rowstatus[i] == SPxBasisBase<R>::Desc::P_ON_UPPER)
            {
               // only consider rows with zero dual multiplier to preserve optimality
               if(EQrel((*theCoPvec)[i], (R) 0, this->epsilon()))
                  slackcandidates.addIdx(i);
            }
         }

         // collect continuous variables that could be made basic
         if(integerVariables.size() == ncols)
         {
            for(int i = 0; i < ncols; ++i)
            {
               // skip fixed variables
               if(colstatus[i] == SPxBasisBase<R>::Desc::P_ON_LOWER
                     || colstatus[i] ==  SPxBasisBase<R>::Desc::P_ON_UPPER)
               {
                  // only consider continuous variables with zero dual multiplier to preserve optimality
                  if(EQrel(this->maxObj(i) - (*thePvec)[i], (R) 0, this->epsilon()) && integerVariables[i] == 0)
                     continuousvars.addIdx(i);
               }
            }
         }

         while(!stop)
         {
            nSuccessfulPivots = 0;

            // identify nonbasic slack variables, i.e. rows, that may be moved into the basis
            for(int i = slackcandidates.size() - 1; i >= 0 && !stop; --i)
            {
               // coverity[forward_null]
               polishId = coId(slackcandidates.index(i));
               SPxOut::debug(this, "try pivoting: {} stat: {}\n", polishId, rowstatus[slackcandidates.index(i)]);
               success = enter(polishId, true);
               clearUpdateVecs();

               if(success)
               {
                  SPxOut::debug(this, " -> success!");
                  ++nSuccessfulPivots;
                  slackcandidates.remove(i);

                  if(maxIters >= 0 && iterations() >= maxIters)
                     stop = true;
               }

               SPxOut::debug(this, "\n");

               if(isTimeLimitReached())
                  stop = true;
            }

            // identify nonbasic variables that may be moved into the basis
            for(int i = continuousvars.size() - 1; i >= 0 && !stop; --i)
            {
               polishId = id(continuousvars.index(i));
               SPxOut::debug(this, "try pivoting: {} stat: {}\n", polishId, colstatus[continuousvars.index(i)]);
               success = enter(polishId, true);
               clearUpdateVecs();

               if(success)
               {
                  SPxOut::debug(this, " -> success!");
                  ++nSuccessfulPivots;
                  continuousvars.remove(i);

                  if(maxIters >= 0 && iterations() >= maxIters)
                     stop = true;
               }

               SPxOut::debug(this, "\n");

               if(isTimeLimitReached())
                  stop = true;
            }

            // terminate if in the last round no more polishing steps were performed
            if(nSuccessfulPivots == 0)
               stop = true;

            polishCount += nSuccessfulPivots;
         }
      }
      else
      {
         assert(polishObj == POLISH_FRACTIONALITY);
         assert(dim() >= 0);
         DIdxSet candidates(dim());

         // identify nonbasic variables, i.e. columns, that may be moved into the basis
         for(int i = 0; i < this->nCols() && !stop; ++i)
         {
            if(colstatus[i] == SPxBasisBase<R>::Desc::P_ON_LOWER
                  || colstatus[i] == SPxBasisBase<R>::Desc::P_ON_UPPER)
            {
               // only consider variables with zero reduced costs to preserve optimality
               if(EQrel(this->maxObj(i) - (*thePvec)[i], (R) 0, this->epsilon()))
                  candidates.addIdx(i);
            }
         }

         while(!stop)
         {
            nSuccessfulPivots = 0;

            for(int i = candidates.size() - 1; i >= 0 && !stop; --i)
            {
               // coverity[forward_null]
               polishId = id(candidates.index(i));
               SPxOut::debug(this, "try pivoting: {} stat: {}\n", polishId, colstatus[candidates.index(i)]);
               success = enter(polishId, true);
               clearUpdateVecs();

               if(success)
               {
                  SPxOut::debug(this, " -> success!");
                  ++nSuccessfulPivots;
                  candidates.remove(i);

                  if(maxIters >= 0 && iterations() >= maxIters)
                     stop = true;
               }

               SPxOut::debug(this, "\n");

               if(isTimeLimitReached())
                  stop = true;
            }

            // terminate if in the last round no more polishing steps were performed
            if(nSuccessfulPivots == 0)
               stop = true;

            polishCount += nSuccessfulPivots;
         }
      }
   }
   else
   {
      setType(LEAVE); // use primal simplex to preserve feasibility
      init();
      alloweddeviation = leavetol();
      instableLeave = false;
      theratiotester->setType(type());
      bool useIntegrality = false;
      int ncols = this->nCols();

      if(integerVariables.size() == ncols)
         useIntegrality = true;

      // in ROW rep: pivot slack out of the basis
      if(polishObj == POLISH_INTEGRALITY)
      {
         assert(dim() >= 0);
         DIdxSet basiccandidates(dim());

         // collect basic candidates that may be moved out of the basis
         for(int i = 0; i < dim(); ++i)
         {
            polishId = this->baseId(i);

            if(polishId.isSPxRowId())
               stat = ds.rowStatus(this->number(polishId));
            else
            {
               // skip (integer) variables
               if(!useIntegrality || integerVariables[this->number(SPxColId(polishId))] == 1)
                  continue;

               stat = ds.colStatus(this->number(polishId));
            }

            if(stat == SPxBasisBase<R>::Desc::P_ON_LOWER || stat ==  SPxBasisBase<R>::Desc::P_ON_UPPER)
            {
               if(EQrel((*theFvec)[i], (R) 0, this->epsilon()))
                  basiccandidates.addIdx(i);
            }
         }

         while(!stop)
         {
            nSuccessfulPivots = 0;

            for(int i = basiccandidates.size() - 1; i >= 0 && !stop; --i)
            {
               // coverity[forward_null]
               SPxOut::debug(this, "try pivoting: {}", this->baseId(basiccandidates.index(i)));
               success = leave(basiccandidates.index(i), true);
               clearUpdateVecs();

               if(success)
               {
                  SPxOut::debug(this, " -> success!");
                  ++nSuccessfulPivots;
                  basiccandidates.remove(i);

                  if(maxIters >= 0 && iterations() >= maxIters)
                     stop = true;
               }

               SPxOut::debug(this, "\n");

               if(isTimeLimitReached())
                  stop = true;
            }

            // terminate if in the last round no more polishing steps were performed
            if(nSuccessfulPivots == 0)
               stop = true;

            polishCount += nSuccessfulPivots;
         }
      }
      else
      {
         assert(polishObj == POLISH_FRACTIONALITY);
         assert(dim() >= 0);
         DIdxSet basiccandidates(dim());

         // collect basic (integer) variables, that may be moved out of the basis
         for(int i = 0; i < dim(); ++i)
         {
            polishId = this->baseId(i);

            if(polishId.isSPxRowId())
               continue;
            else
            {
               if(useIntegrality && integerVariables[this->number(SPxColId(polishId))] == 0)
                  continue;

               stat = ds.colStatus(i);
            }

            if(stat == SPxBasisBase<R>::Desc::P_ON_LOWER || stat ==  SPxBasisBase<R>::Desc::P_ON_UPPER)
            {
               if(EQrel((*theFvec)[i], (R) 0, this->epsilon()))
                  basiccandidates.addIdx(i);
            }
         }

         while(!stop)
         {
            nSuccessfulPivots = 0;

            for(int i = basiccandidates.size() - 1; i >= 0 && !stop; --i)
            {
               // coverity[forward_null]
               SPxOut::debug(this, "try pivoting: {}", this->baseId(basiccandidates.index(i)));
               success = leave(basiccandidates.index(i), true);
               clearUpdateVecs();

               if(success)
               {
                  SPxOut::debug(this, " -> success!");
                  ++nSuccessfulPivots;
                  basiccandidates.remove(i);

                  if(maxIters >= 0 && iterations() >= maxIters)
                     stop = true;
               }

               SPxOut::debug(this, "\n");

               if(isTimeLimitReached())
                  stop = true;
            }

            // terminate if in the last round no more polishing steps were performed
            if(nSuccessfulPivots == 0)
               stop = true;

            polishCount += nSuccessfulPivots;
         }
      }
   }

   SPX_MSG_INFO1((*this->spxout),
                 (*this->spxout) << " --- finished solution polishing (" << polishCount << " pivots)" << std::endl;)

   this->setStatus(SPxBasisBase<R>::OPTIMAL);

   // if the value() changed significantly (due to numerics) reoptimize after polishing
   if(!EQrel(value(), origval, alloweddeviation))
      return true;
   else
      return false;
}